

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_OneEmpty(JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t lenRight;
  undefined4 *puVar5;
  ScriptContext *scriptContext;
  JavascriptString *pJVar6;
  char16_t *pcVar7;
  char16_t *local_40;
  JavascriptString *pstRight_local;
  JavascriptString *this_local;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1f5,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  cVar4 = GetLength(this);
  if ((cVar4 != 0) && (cVar4 = GetLength(pstRight), cVar4 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1f6,"(GetLength() == 0 || pstRight->GetLength() == 0)",
                                "GetLength() == 0 || pstRight->GetLength() == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  scriptContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  cVar4 = GetLength(this);
  lenRight = GetLength(pstRight);
  StringProfiler::RecordConcatenation(scriptContext,cVar4,lenRight,ConcatType_Unknown);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
  if (bVar2) {
    bVar2 = IsFinalized(pstRight);
    if (bVar2) {
      local_40 = GetString(pstRight);
    }
    else {
      local_40 = L"";
    }
    bVar3 = IsFinalized(pstRight);
    bVar2 = true;
    if (bVar3) {
      cVar4 = GetLength(pstRight);
      bVar2 = 8 < cVar4;
    }
    pcVar7 = L"";
    if (bVar2) {
      pcVar7 = L"...";
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - one side empty, using other side\n"
                  ,local_40,pcVar7);
    Output::Flush();
  }
  cVar4 = GetLength(this);
  if (cVar4 == 0) {
    this_local = CompoundString::GetImmutableOrScriptUnreferencedString(pstRight);
  }
  else {
    pJVar6 = CompoundString::GetImmutableOrScriptUnreferencedString(this);
    this_local = this;
    if (pJVar6 != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0x208,
                                  "(CompoundString::GetImmutableOrScriptUnreferencedString(this) == this)"
                                  ,
                                  "CompoundString::GetImmutableOrScriptUnreferencedString(this) == this"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return this_local;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_OneEmpty(JavascriptString* pstRight)
    {
        Assert(pstRight);
        Assert(GetLength() == 0 || pstRight->GetLength() == 0);

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength());
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - one side empty, using other side\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        if(GetLength() == 0)
        {
            return CompoundString::GetImmutableOrScriptUnreferencedString(pstRight);
        }
        Assert(CompoundString::GetImmutableOrScriptUnreferencedString(this) == this);
        return this;
    }